

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLatch.c
# Opt level: O0

char * Abc_NtkCollectLatchValuesStr(Abc_Ntk_t *pNtk)

{
  int iVar1;
  char *pcVar2;
  Abc_Obj_t *pObj;
  int local_24;
  int i;
  Abc_Obj_t *pLatch;
  char *pInits;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkLatchNum(pNtk);
  pcVar2 = (char *)malloc((long)(iVar1 + 1));
  local_24 = 0;
  do {
    iVar1 = Vec_PtrSize(pNtk->vBoxes);
    if (iVar1 <= local_24) {
      pcVar2[local_24] = '\0';
      return pcVar2;
    }
    pObj = Abc_NtkBox(pNtk,local_24);
    iVar1 = Abc_ObjIsLatch(pObj);
    if (iVar1 != 0) {
      iVar1 = Abc_LatchIsInit0(pObj);
      if (iVar1 == 0) {
        iVar1 = Abc_LatchIsInit1(pObj);
        if (iVar1 == 0) {
          iVar1 = Abc_LatchIsInitDc(pObj);
          if (iVar1 == 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcLatch.c"
                          ,0xe3,"char *Abc_NtkCollectLatchValuesStr(Abc_Ntk_t *)");
          }
          pcVar2[local_24] = 'x';
        }
        else {
          pcVar2[local_24] = '1';
        }
      }
      else {
        pcVar2[local_24] = '0';
      }
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

char * Abc_NtkCollectLatchValuesStr( Abc_Ntk_t * pNtk )
{
    char * pInits;
    Abc_Obj_t * pLatch;
    int i;
    pInits = ABC_ALLOC( char, Abc_NtkLatchNum(pNtk) + 1 );
    Abc_NtkForEachLatch( pNtk, pLatch, i )
    {
        if ( Abc_LatchIsInit0(pLatch) )
            pInits[i] = '0';
        else if ( Abc_LatchIsInit1(pLatch) )
            pInits[i] = '1';
        else if ( Abc_LatchIsInitDc(pLatch) )
            pInits[i] = 'x';
        else
            assert( 0 );
    }
    pInits[i] = 0;
    return pInits;
}